

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-lexer.cc
# Opt level: O3

Token * __thiscall wabt::WastLexer::GetNanToken(Token *__return_storage_ptr__,WastLexer *this)

{
  byte *pbVar1;
  bool bVar2;
  ReservedChars RVar3;
  char *saved_cursor;
  byte *pbVar4;
  byte *pbVar5;
  byte *pbVar6;
  long lVar7;
  uint uVar8;
  
  pbVar1 = (byte *)this->buffer_end_;
  pbVar6 = (byte *)this->cursor_;
  lVar7 = 0;
  pbVar4 = pbVar6;
  do {
    uVar8 = 0xffffffff;
    pbVar5 = pbVar4;
    if (pbVar4 < pbVar1) {
      pbVar5 = pbVar4 + 1;
      this->cursor_ = (char *)pbVar5;
      uVar8 = (uint)*pbVar4;
    }
    if (uVar8 != (int)"nan"[lVar7]) goto LAB_001797f9;
    lVar7 = lVar7 + 1;
    pbVar4 = pbVar5;
  } while (lVar7 != 3);
  if ((pbVar5 < pbVar1) && (*pbVar5 == 0x3a)) {
    pbVar6 = pbVar5 + 1;
    this->cursor_ = (char *)pbVar6;
    lVar7 = 0;
    pbVar4 = pbVar6;
    do {
      uVar8 = 0xffffffff;
      pbVar5 = pbVar4;
      if (pbVar4 < pbVar1) {
        pbVar5 = pbVar4 + 1;
        this->cursor_ = (char *)pbVar5;
        uVar8 = (uint)*pbVar4;
      }
      if (uVar8 != (int)":0x"[lVar7 + 1]) goto LAB_001797f9;
      lVar7 = lVar7 + 1;
      pbVar4 = pbVar5;
    } while (lVar7 != 2);
    bVar2 = ReadHexNum(this);
    if (!bVar2) goto LAB_001797fd;
  }
  RVar3 = ReadReservedChars(this);
  if (RVar3 == None) {
    LiteralToken(__return_storage_ptr__,this,First_Literal,Nan);
    return __return_storage_ptr__;
  }
LAB_001797fd:
  GetKeywordToken(__return_storage_ptr__,this);
  return __return_storage_ptr__;
LAB_001797f9:
  this->cursor_ = (char *)pbVar6;
  goto LAB_001797fd;
}

Assistant:

Token WastLexer::GetNanToken() {
  if (MatchString("nan")) {
    if (MatchChar(':')) {
      if (MatchString("0x") && ReadHexNum() && NoTrailingReservedChars()) {
        return LiteralToken(TokenType::Float, LiteralType::Nan);
      }
    } else if (NoTrailingReservedChars()) {
      return LiteralToken(TokenType::Float, LiteralType::Nan);
    }
  }
  return GetKeywordToken();
}